

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

int xmlTextReaderValidateEntity(xmlTextReaderPtr reader)

{
  xmlElementType xVar1;
  xmlNodePtr pxVar2;
  _xmlNode *p_Var3;
  xmlChar *str;
  int iVar4;
  long lVar5;
  xmlNodePtr pxVar6;
  _xmlNode *value;
  
  pxVar2 = reader->node;
  value = pxVar2;
  do {
    xVar1 = value->type;
    if (xVar1 - XML_TEXT_NODE < 2) {
      str = value->content;
      iVar4 = xmlStrlen(str);
      xmlTextReaderValidateCData(reader,str,iVar4);
LAB_001750d8:
      pxVar6 = value->children;
      if (value->children == (xmlNodePtr)0x0) {
        if ((value->type == XML_ELEMENT_NODE) &&
           (iVar4 = xmlTextReaderValidatePop(reader), iVar4 < 0)) {
          return -1;
        }
LAB_00175106:
        pxVar6 = value->next;
        if (value->next == (xmlNodePtr)0x0) {
          do {
            value = value->parent;
            if (value->type == XML_ELEMENT_NODE) {
              if (reader->entNr == 0) {
                while ((pxVar6 = value->last, pxVar6 != (xmlNodePtr)0x0 &&
                       ((pxVar6->extra & 2) == 0))) {
                  xmlUnlinkNode(pxVar6);
                  xmlTextReaderFreeNode(reader,pxVar6);
                }
              }
              reader->node = value;
              iVar4 = xmlTextReaderValidatePop(reader);
              if (iVar4 < 0) {
                return -1;
              }
            }
            if (((value->type == XML_ENTITY_DECL) && (reader->ent != (xmlNodePtr)0x0)) &&
               (reader->ent->children == value)) {
              iVar4 = reader->entNr;
              lVar5 = (long)iVar4;
              if (lVar5 < 1) {
                value = (xmlNodePtr)0x0;
              }
              else {
                reader->entNr = iVar4 + -1;
                if (iVar4 == 1) {
                  pxVar6 = (xmlNodePtr)0x0;
                }
                else {
                  pxVar6 = reader->entTab[lVar5 + -2];
                }
                reader->ent = pxVar6;
                value = reader->entTab[lVar5 + -1];
                reader->entTab[lVar5 + -1] = (xmlNodePtr)0x0;
              }
            }
            pxVar6 = value;
          } while ((((value != pxVar2) && (pxVar6 = value->next, value->next == (xmlNodePtr)0x0)) &&
                   (pxVar6 = value, value != (xmlNodePtr)0x0)) && (value != pxVar2));
        }
      }
    }
    else {
      if (xVar1 == XML_ELEMENT_NODE) {
        reader->node = value;
        iVar4 = xmlTextReaderValidatePush(reader);
        if (iVar4 < 0) {
          return -1;
        }
        goto LAB_001750d8;
      }
      if (xVar1 != XML_ENTITY_REF_NODE) goto LAB_001750d8;
      p_Var3 = value->children;
      if ((((p_Var3 == (_xmlNode *)0x0) || (p_Var3->type != XML_ENTITY_DECL)) ||
          (p_Var3->children == (_xmlNode *)0x0)) ||
         (iVar4 = xmlTextReaderEntPush(reader,value), iVar4 < 0)) {
        if (value != pxVar2) goto LAB_00175106;
LAB_001751fd:
        reader->node = pxVar2;
        return 0;
      }
      pxVar6 = value->children->children;
    }
    if ((pxVar6 == (xmlNodePtr)0x0) || (value = pxVar6, pxVar6 == pxVar2)) goto LAB_001751fd;
  } while( true );
}

Assistant:

static int
xmlTextReaderValidateEntity(xmlTextReaderPtr reader) {
    xmlNodePtr oldnode = reader->node;
    xmlNodePtr node = reader->node;

    do {
	if (node->type == XML_ENTITY_REF_NODE) {
	    if ((node->children != NULL) &&
		(node->children->type == XML_ENTITY_DECL) &&
		(node->children->children != NULL)) {
		if (xmlTextReaderEntPush(reader, node) < 0) {
                    if (node == oldnode)
                        break;
                    goto skip_children;
                }
		node = node->children->children;
		continue;
	    } else {
		/*
		 * The error has probably been raised already.
		 */
		if (node == oldnode)
		    break;
                goto skip_children;
	    }
#ifdef LIBXML_REGEXP_ENABLED
	} else if (node->type == XML_ELEMENT_NODE) {
	    reader->node = node;
	    if (xmlTextReaderValidatePush(reader) < 0)
                return(-1);
	} else if ((node->type == XML_TEXT_NODE) ||
		   (node->type == XML_CDATA_SECTION_NODE)) {
            xmlTextReaderValidateCData(reader, node->content,
	                               xmlStrlen(node->content));
#endif
	}

	/*
	 * go to next node
	 */
	if (node->children != NULL) {
	    node = node->children;
	    continue;
	} else if (node->type == XML_ELEMENT_NODE) {
	    if (xmlTextReaderValidatePop(reader) < 0)
                return(-1);
	}
skip_children:
	if (node->next != NULL) {
	    node = node->next;
	    continue;
	}
	do {
	    node = node->parent;
	    if (node->type == XML_ELEMENT_NODE) {
	        xmlNodePtr tmp;
		if (reader->entNr == 0) {
		    while ((tmp = node->last) != NULL) {
			if ((tmp->extra & NODE_IS_PRESERVED) == 0) {
			    xmlUnlinkNode(tmp);
			    xmlTextReaderFreeNode(reader, tmp);
			} else
			    break;
		    }
		}
		reader->node = node;
		if (xmlTextReaderValidatePop(reader) < 0)
                    return(-1);
	    }
	    if ((node->type == XML_ENTITY_DECL) &&
		(reader->ent != NULL) && (reader->ent->children == node)) {
		node = xmlTextReaderEntPop(reader);
	    }
	    if (node == oldnode)
		break;
	    if (node->next != NULL) {
		node = node->next;
		break;
	    }
	} while ((node != NULL) && (node != oldnode));
    } while ((node != NULL) && (node != oldnode));
    reader->node = oldnode;

    return(0);
}